

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::CompressionParameters> *
kj::_::validateCompressionConfig
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,UnverifiedConfig *config,
          bool isAgreement)

{
  byte bVar1;
  byte bVar2;
  kj *this;
  size_t sVar3;
  NullableValue<unsigned_long> *pNVar4;
  unsigned_long *puVar5;
  CompressionParameters *t;
  ArrayPtr<const_char> *params;
  ArrayPtr<const_char> *params_00;
  unsigned_long *bits_1;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  NullableValue<unsigned_long> _bits5023;
  unsigned_long local_d0;
  kj *local_c8;
  ArrayPtr<const_char> *clientBits;
  ArrayPtr<const_char> *_clientBits5012;
  unsigned_long *local_b0;
  unsigned_long *bits;
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  NullableValue<unsigned_long> _bits4995;
  ArrayPtr<const_char> *serverBits;
  ArrayPtr<const_char> *_serverBits4989;
  CompressionParameters result;
  bool isAgreement_local;
  UnverifiedConfig *config_local;
  
  result.inboundMaxWindowBits.ptr.field_1.value._7_1_ = isAgreement;
  CompressionParameters::CompressionParameters((CompressionParameters *)&_serverBits4989);
  this = (kj *)readMaybe<kj::ArrayPtr<char_const>>(&config->serverMaxWindowBits);
  if (this != (kj *)0x0) {
    sVar3 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)this);
    if (sVar3 == 0) {
      Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
      _bits4995.field_1.value._0_4_ = 1;
      goto LAB_0061f551;
    }
    str<kj::ArrayPtr<char_const>&>((String *)&bits,this,params);
    String::tryParseAs<unsigned_long>((String *)local_90);
    pNVar4 = readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_90);
    NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_80,pNVar4);
    Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_90);
    String::~String((String *)&bits);
    puVar5 = NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_80);
    if (puVar5 == (unsigned_long *)0x0) {
      Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
      _bits4995.field_1.value._0_4_ = 1;
    }
    else {
      local_b0 = NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_80);
      if ((*local_b0 < 8) || (0xf < *local_b0)) {
        Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
        _bits4995.field_1.value._0_4_ = 1;
      }
      else {
        if ((result.inboundMaxWindowBits.ptr.field_1.value._7_1_ & 1) == 0) {
          Maybe<unsigned_long>::operator=((Maybe<unsigned_long> *)&result,local_b0);
        }
        else {
          Maybe<unsigned_long>::operator=
                    ((Maybe<unsigned_long> *)&result.outboundMaxWindowBits.ptr.field_1,local_b0);
        }
        _bits4995.field_1.value._0_4_ = 0;
      }
    }
    NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_80);
    if (_bits4995.field_1.value._0_4_ != 0) goto LAB_0061f551;
  }
  clientBits = readMaybe<kj::ArrayPtr<char_const>>(&config->clientMaxWindowBits);
  if ((kj *)clientBits != (kj *)0x0) {
    local_c8 = (kj *)clientBits;
    sVar3 = ArrayPtr<const_char>::size(clientBits);
    if (sVar3 == 0) {
      if ((result.inboundMaxWindowBits.ptr.field_1.value._7_1_ & 1) != 0) {
        Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
        _bits4995.field_1.value._0_4_ = 1;
        goto LAB_0061f551;
      }
      local_d0 = 0xf;
      Maybe<unsigned_long>::operator=
                ((Maybe<unsigned_long> *)&result.outboundMaxWindowBits.ptr.field_1,&local_d0);
    }
    else {
      str<kj::ArrayPtr<char_const>&>((String *)&bits_1,local_c8,params_00);
      String::tryParseAs<unsigned_long>((String *)local_f8);
      pNVar4 = readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_f8);
      NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_e8,pNVar4);
      Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_f8);
      String::~String((String *)&bits_1);
      puVar5 = NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_e8);
      if (puVar5 == (unsigned_long *)0x0) {
        Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
        _bits4995.field_1.value._0_4_ = 1;
      }
      else {
        puVar5 = NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_e8);
        if ((*puVar5 < 8) || (0xf < *puVar5)) {
          Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
          _bits4995.field_1.value._0_4_ = 1;
        }
        else {
          if ((result.inboundMaxWindowBits.ptr.field_1.value._7_1_ & 1) == 0) {
            Maybe<unsigned_long>::operator=
                      ((Maybe<unsigned_long> *)&result.outboundMaxWindowBits.ptr.field_1,puVar5);
          }
          else {
            Maybe<unsigned_long>::operator=((Maybe<unsigned_long> *)&result,puVar5);
          }
          _bits4995.field_1.value._0_4_ = 0;
        }
      }
      NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_e8);
      if (_bits4995.field_1.value._0_4_ != 0) goto LAB_0061f551;
    }
  }
  if ((result.inboundMaxWindowBits.ptr.field_1.value._7_1_ & 1) == 0) {
    bVar2 = config->clientNoContextTakeover;
    bVar1 = config->serverNoContextTakeover;
  }
  else {
    bVar1 = config->clientNoContextTakeover;
    bVar2 = config->serverNoContextTakeover;
  }
  _serverBits4989._1_1_ = bVar2 & 1;
  _serverBits4989._0_1_ = bVar1 & 1;
  t = mv<kj::CompressionParameters>((CompressionParameters *)&_serverBits4989);
  Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__,t);
  _bits4995.field_1.value._0_4_ = 1;
LAB_0061f551:
  CompressionParameters::~CompressionParameters((CompressionParameters *)&_serverBits4989);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> validateCompressionConfig(UnverifiedConfig&& config,
    bool isAgreement) {
  // Verifies that the `config` is valid depending on whether we're validating a Request (offer) or
  // a Response (agreement). This essentially consumes the `UnverifiedConfig` and converts it into a
  // `CompressionParameters` struct.
  CompressionParameters result;

  KJ_IF_SOME(serverBits, config.serverMaxWindowBits) {
    if (serverBits.size() == 0) {
      // This means `server_max_window_bits` was passed without a value. Since a value is required,
      // this config is invalid.
      return kj::none;
    } else {
      KJ_IF_SOME(bits, kj::str(serverBits).tryParseAs<size_t>()) {
        if (bits < 8 || 15 < bits) {
          // Out of range -- invalid.
          return kj::none;
        }
        if (isAgreement) {
          result.inboundMaxWindowBits = bits;
        } else {
          result.outboundMaxWindowBits = bits;
        }
      } else {
        // Invalid ABNF, expected 1*DIGIT.
        return kj::none;
      }
    }
  }